

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

float __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,int variable,bit_array *x)

{
  int *piVar1;
  int iVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 in_register_00001304 [12];
  undefined1 local_30 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_30,(int)this + 0x10);
  if (local_30._8_8_ == local_30._0_8_) {
    auVar6 = ZEXT864(0);
  }
  else {
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar6 = ZEXT864(0);
    do {
      iVar2 = *(int *)local_30._8_8_;
      piVar1 = (int *)(local_30._8_8_ + 4);
      local_30._8_8_ = local_30._8_8_ + 8;
      auVar5._0_4_ = (float)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                            _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl[iVar2];
      auVar5._4_12_ = in_register_00001304;
      auVar5 = vandps_avx(auVar5,auVar4);
      auVar5 = vfmadd231ss_fma(auVar6._0_16_,auVar5,
                               ZEXT416((uint)((this->pi)._M_t.
                                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                              .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                              [*piVar1] +
                                             (this->P)._M_t.
                                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                             .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                             [iVar2])));
      auVar6 = ZEXT1664(auVar5);
    } while (local_30._8_8_ != local_30._0_8_);
  }
  fVar3 = quadratic_cost_type<float>::operator()(this->c,variable,x);
  return fVar3 - auVar6._0_4_;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }